

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O3

void __thiscall
QHashPrivate::Data<QHashPrivate::Node<QString,_QVariant>_>::rehash
          (Data<QHashPrivate::Node<QString,_QVariant>_> *this,size_t sizeHint)

{
  Entry *pEVar1;
  uchar *puVar2;
  ulong uVar3;
  Span *pSVar4;
  Entry *pEVar5;
  Data *pDVar6;
  char16_t *pcVar7;
  qsizetype qVar8;
  PrivateShared *pPVar9;
  undefined8 uVar10;
  uchar uVar11;
  uchar uVar12;
  uchar uVar13;
  uchar uVar14;
  uchar uVar15;
  uchar uVar16;
  uchar uVar17;
  uchar uVar18;
  ulong uVar19;
  Node<QString,_QVariant> *pNVar20;
  ulong uVar21;
  size_t index;
  long lVar22;
  size_t sVar23;
  long lVar24;
  QStringView QVar25;
  R_conflict6 RVar26;
  Bucket BVar27;
  Span *local_50;
  
  if (sizeHint == 0) {
    sizeHint = this->size;
  }
  sVar23 = 0x80;
  if ((0x40 < sizeHint) && (sVar23 = 0xffffffffffffffff, sizeHint < 0x4000000000000000)) {
    lVar22 = 0x3f;
    if (sizeHint != 0) {
      for (; sizeHint >> lVar22 == 0; lVar22 = lVar22 + -1) {
      }
    }
    sVar23 = 1L << (0x41 - ((byte)lVar22 ^ 0x3f) & 0x3f);
  }
  uVar3 = this->numBuckets;
  pSVar4 = this->spans;
  RVar26 = allocateSpans(sVar23);
  this->spans = (Span *)RVar26.spans;
  this->numBuckets = sVar23;
  if (uVar3 < 0x80) {
    if (pSVar4 == (Span *)0x0) {
      return;
    }
  }
  else {
    uVar21 = 0;
    local_50 = pSVar4;
    do {
      lVar22 = 0;
      do {
        uVar19 = (ulong)local_50->offsets[lVar22];
        if (uVar19 != 0xff) {
          pEVar5 = pSVar4[uVar21].entries;
          QVar25.m_data = *(storage_type_conflict **)(pEVar5[uVar19].storage.data + 8);
          QVar25.m_size = *(qsizetype *)(pEVar5[uVar19].storage.data + 0x10);
          sVar23 = qHash(QVar25,this->seed);
          BVar27 = findBucketWithHash<QString>(this,(QString *)(pEVar5 + uVar19),sVar23);
          pNVar20 = Span<QHashPrivate::Node<QString,_QVariant>_>::insert(BVar27.span,BVar27.index);
          pDVar6 = *(Data **)pEVar5[uVar19].storage.data;
          pEVar1 = pEVar5 + uVar19;
          (pEVar1->storage).data[0] = '\0';
          (pEVar1->storage).data[1] = '\0';
          (pEVar1->storage).data[2] = '\0';
          (pEVar1->storage).data[3] = '\0';
          (pEVar1->storage).data[4] = '\0';
          (pEVar1->storage).data[5] = '\0';
          (pEVar1->storage).data[6] = '\0';
          (pEVar1->storage).data[7] = '\0';
          (pNVar20->key).d.d = pDVar6;
          pcVar7 = *(char16_t **)(pEVar5[uVar19].storage.data + 8);
          pEVar1 = pEVar5 + uVar19;
          (pEVar1->storage).data[8] = '\0';
          (pEVar1->storage).data[9] = '\0';
          (pEVar1->storage).data[10] = '\0';
          (pEVar1->storage).data[0xb] = '\0';
          (pEVar1->storage).data[0xc] = '\0';
          (pEVar1->storage).data[0xd] = '\0';
          (pEVar1->storage).data[0xe] = '\0';
          (pEVar1->storage).data[0xf] = '\0';
          (pNVar20->key).d.ptr = pcVar7;
          qVar8 = *(qsizetype *)(pEVar5[uVar19].storage.data + 0x10);
          pEVar1 = pEVar5 + uVar19;
          (pEVar1->storage).data[0x10] = '\0';
          (pEVar1->storage).data[0x11] = '\0';
          (pEVar1->storage).data[0x12] = '\0';
          (pEVar1->storage).data[0x13] = '\0';
          (pEVar1->storage).data[0x14] = '\0';
          (pEVar1->storage).data[0x15] = '\0';
          (pEVar1->storage).data[0x16] = '\0';
          (pEVar1->storage).data[0x17] = '\0';
          (pNVar20->key).d.size = qVar8;
          puVar2 = pEVar5[uVar19].storage.data + 0x18;
          pPVar9 = *(PrivateShared **)puVar2;
          uVar10 = *(undefined8 *)(puVar2 + 8);
          puVar2 = pEVar5[uVar19].storage.data + 0x28;
          uVar11 = puVar2[8];
          uVar12 = puVar2[9];
          uVar13 = puVar2[10];
          uVar14 = puVar2[0xb];
          uVar15 = puVar2[0xc];
          uVar16 = puVar2[0xd];
          uVar17 = puVar2[0xe];
          uVar18 = puVar2[0xf];
          *(undefined8 *)((long)&(pNVar20->value).d.data + 0x10) = *(undefined8 *)puVar2;
          (pNVar20->value).d.field_0x18 = uVar11;
          (pNVar20->value).d.field_0x19 = uVar12;
          (pNVar20->value).d.field_0x1a = uVar13;
          (pNVar20->value).d.field_0x1b = uVar14;
          (pNVar20->value).d.field_0x1c = uVar15;
          (pNVar20->value).d.field_0x1d = uVar16;
          (pNVar20->value).d.field_0x1e = uVar17;
          (pNVar20->value).d.field_0x1f = uVar18;
          (pNVar20->value).d.data.shared = pPVar9;
          *(undefined8 *)((long)&(pNVar20->value).d.data + 8) = uVar10;
          puVar2 = pEVar5[uVar19].storage.data + 0x18;
          puVar2[0] = '\0';
          puVar2[1] = '\0';
          puVar2[2] = '\0';
          puVar2[3] = '\0';
          puVar2[4] = '\0';
          puVar2[5] = '\0';
          puVar2[6] = '\0';
          puVar2[7] = '\0';
          puVar2[8] = '\0';
          puVar2[9] = '\0';
          puVar2[10] = '\0';
          puVar2[0xb] = '\0';
          puVar2[0xc] = '\0';
          puVar2[0xd] = '\0';
          puVar2[0xe] = '\0';
          puVar2[0xf] = '\0';
          pEVar1 = pEVar5 + uVar19;
          (pEVar1->storage).data[0x28] = '\0';
          (pEVar1->storage).data[0x29] = '\0';
          (pEVar1->storage).data[0x2a] = '\0';
          (pEVar1->storage).data[0x2b] = '\0';
          (pEVar1->storage).data[0x2c] = '\0';
          (pEVar1->storage).data[0x2d] = '\0';
          (pEVar1->storage).data[0x2e] = '\0';
          (pEVar1->storage).data[0x2f] = '\0';
          pEVar5 = pEVar5 + uVar19;
          (pEVar5->storage).data[0x30] = '\x02';
          (pEVar5->storage).data[0x31] = '\0';
          (pEVar5->storage).data[0x32] = '\0';
          (pEVar5->storage).data[0x33] = '\0';
          (pEVar5->storage).data[0x34] = '\0';
          (pEVar5->storage).data[0x35] = '\0';
          (pEVar5->storage).data[0x36] = '\0';
          (pEVar5->storage).data[0x37] = '\0';
        }
        lVar22 = lVar22 + 1;
      } while (lVar22 != 0x80);
      Span<QHashPrivate::Node<QString,_QVariant>_>::freeData(pSVar4 + uVar21);
      uVar21 = uVar21 + 1;
      local_50 = local_50 + 1;
    } while (uVar21 != uVar3 >> 7);
  }
  lVar22 = *(long *)&pSVar4[-1].allocated;
  if (lVar22 != 0) {
    lVar24 = lVar22 * 0x90;
    do {
      Span<QHashPrivate::Node<QString,_QVariant>_>::freeData
                ((Span<QHashPrivate::Node<QString,_QVariant>_> *)(pSVar4[-1].offsets + lVar24));
      lVar24 = lVar24 + -0x90;
    } while (lVar24 != 0);
  }
  operator_delete__(&pSVar4[-1].allocated,lVar22 * 0x90 + 8);
  return;
}

Assistant:

void rehash(size_t sizeHint = 0)
    {
        if (sizeHint == 0)
            sizeHint = size;
        size_t newBucketCount = GrowthPolicy::bucketsForCapacity(sizeHint);

        Span *oldSpans = spans;
        size_t oldBucketCount = numBuckets;
        spans = allocateSpans(newBucketCount).spans;
        numBuckets = newBucketCount;
        size_t oldNSpans = oldBucketCount >> SpanConstants::SpanShift;

        for (size_t s = 0; s < oldNSpans; ++s) {
            Span &span = oldSpans[s];
            for (size_t index = 0; index < SpanConstants::NEntries; ++index) {
                if (!span.hasNode(index))
                    continue;
                Node &n = span.at(index);
                auto it = findBucket(n.key);
                Q_ASSERT(it.isUnused());
                Node *newNode = it.insert();
                new (newNode) Node(std::move(n));
            }
            span.freeData();
        }
        delete[] oldSpans;
    }